

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void init_beam(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int iVar6;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> this;
  long lVar7;
  double cmr;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double n0;
  undefined8 in_XMM5_Qa;
  double x0b;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar7 = (long)mpi_rank;
  iVar6 = std::__cxx11::string::compare((char *)&beam_particles_abi_cxx11_);
  this = psr;
  if (iVar6 == 0) {
    n0 = (Nb * 1.061e-11) / (rb * rb * xb * lambda);
    bVar4 = 0.0 < epsb;
    bVar5 = epsb < 0.0;
    dVar8 = (epsb * epsb) / 0.261121 + -1.0;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar8;
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar8 = auVar10._0_8_;
    }
    dVar8 = dVar8 * (double)(int)((uint)bVar4 - (uint)bVar5);
    auVar16._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar7];
    auVar16._8_8_ = in_XMM5_Qa;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dx;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = xlength - ::x0b;
    auVar10 = vfnmadd132sd_fma(auVar16,auVar13,auVar3);
    x0b = auVar10._0_8_;
    cmr = 1.0;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&beam_particles_abi_cxx11_);
    this = psr;
    n0 = (Nb * 1.061e-11) / (rb * xb * rb * lambda);
    if (iVar6 == 0) {
      dVar8 = epsb / 0.511;
      auVar14._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
      auVar14._8_8_ = in_XMM5_Qa;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dx;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = xlength - ::x0b;
      auVar10 = vfnmadd132sd_fma(auVar14,auVar11,auVar1);
      x0b = auVar10._0_8_;
      cmr = 0.0;
    }
    else {
      bVar4 = 0.0 < epsb;
      bVar5 = epsb < 0.0;
      dVar8 = (epsb * epsb) / 0.261121 + -1.0;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar8;
        auVar10 = vsqrtsd_avx(auVar9,auVar9);
        dVar8 = auVar10._0_8_;
      }
      dVar8 = dVar8 * (double)(int)((uint)bVar4 - (uint)bVar5);
      auVar15._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
      auVar15._8_8_ = in_XMM5_Qa;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = dx;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = xlength - ::x0b;
      auVar10 = vfnmadd132sd_fma(auVar15,auVar12,auVar2);
      x0b = auVar10._0_8_;
      cmr = -1.0;
    }
  }
  spatial_region::add_beam
            ((spatial_region *)
             this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,cmr,n0,dVar8,xb,rb,x0b,y0b,
             phib);
  return;
}

Assistant:

void init_beam()
{
    int i = mpi_rank;
    if (beam_particles=="p")
        psr->add_beam(1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else if (beam_particles=="ph")
        psr->add_beam(0,Nb*1.061e-11/(xb*rb*rb*lambda),epsb/0.511,xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else
        psr->add_beam(-1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
}